

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

void __thiscall CWire::Print(CWire *this,FILE *pFile,int Mode)

{
  char cVar1;
  short sVar2;
  short sVar3;
  CPoint *pCVar4;
  CPoint *pCVar5;
  CObject *pCVar6;
  int iVar7;
  longlong in_RAX;
  size_t sVar8;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvVar9;
  pointer ppCVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  longlong Key;
  
  if (pFile == (FILE *)0x0) {
    return;
  }
  Key = in_RAX;
  if (Mode < 0x80) {
    if (Mode < 0x10) {
      if (Mode == 0) {
        pCVar4 = this->m_pPointE;
        pCVar5 = this->m_pPointS;
        fprintf((FILE *)pFile,"-w (%d,%d,%d)-(%d,%d,%d) %c",(ulong)(uint)(int)pCVar5->m_iX,
                (ulong)(uint)(int)pCVar5->m_iY,(ulong)(uint)(int)pCVar5->m_cZ,
                (ulong)(uint)(int)pCVar4->m_iX,(ulong)(uint)(int)pCVar4->m_iY,
                (ulong)(uint)(int)pCVar4->m_cZ,
                (ulong)((uint)(((this->super_CObject).m_iState & 1) == 0) * 9 + 0x6f));
        pCVar6 = (this->super_CObject).m_pParent;
        if (pCVar6 != (CObject *)0x0) {
          fprintf((FILE *)pFile,":net(id:%d) ",(ulong)(uint)pCVar6->m_Key);
        }
        fputc(10,(FILE *)pFile);
        goto LAB_0011f8ea;
      }
      if (Mode != 1) goto LAB_0011f985;
      uVar11 = (uint)this->m_pPointS->m_iX;
      uVar14 = (uint)this->m_pPointS->m_iY;
      fprintf((FILE *)pFile,"plot([%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar11,(ulong)uVar11,
              (ulong)uVar14,(ulong)uVar14,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      uVar11 = (uint)this->m_pPointE->m_iX;
      uVar14 = (uint)this->m_pPointE->m_iY;
      fprintf((FILE *)pFile,"plot([%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar11,(ulong)uVar11,
              (ulong)uVar14,(ulong)uVar14,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      uVar12 = (ulong)(uint)(int)this->m_pPointS->m_iX;
      uVar17 = (ulong)(uint)(int)this->m_pPointE->m_iX;
      uVar11 = (uint)this->m_pPointS->m_iY;
      sVar2 = this->m_pPointE->m_iY;
      pcVar15 = "-";
      if (((this->super_CObject).m_iState & 1) == 0) {
        pcVar15 = "-.";
      }
      pcVar13 = "plot([%d,%d],[%d,%d],\'%s\');\n";
    }
    else {
      if (Mode == 0x10) {
        fprintf((FILE *)pFile,"-------------net(id:%d) - (%d,%d)-(%d,%d)\n",
                (ulong)(uint)((this->super_CObject).m_pParent)->m_Key,
                (ulong)(uint)(int)this->m_pPointS->m_iX,(ulong)(uint)(int)this->m_pPointS->m_iY,
                (ulong)(uint)(int)this->m_pPointE->m_iX,(ulong)(uint)(int)this->m_pPointE->m_iY);
        fflush((FILE *)pFile);
        if (0 < (int)((ulong)((long)(this->m_SegmentList).
                                    super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_SegmentList).
                                   super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
          uVar11 = 0;
          do {
            pvVar9 = GetSegmentList(this,uVar11);
            fprintf((FILE *)pFile,"*segment[%d]\n",(ulong)uVar11);
            ppCVar10 = (pvVar9->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl
                       .super__Vector_impl_data._M_start;
            if ((pvVar9->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_finish != ppCVar10) {
              uVar17 = 0;
              do {
                (*(ppCVar10[uVar17]->super_CObject)._vptr_CObject[2])(ppCVar10[uVar17],pFile,0);
                uVar17 = uVar17 + 1;
                ppCVar10 = (pvVar9->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                           _M_impl.super__Vector_impl_data._M_start;
              } while (uVar17 < (ulong)((long)(pvVar9->
                                              super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppCVar10 >> 3));
            }
            uVar11 = uVar11 + 1;
            iVar7 = (int)((ulong)((long)(this->m_SegmentList).
                                        super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_SegmentList).
                                       super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
          } while (SBORROW4(uVar11,iVar7 * -0x55555555) != (int)(uVar11 + iVar7 * 0x55555555) < 0);
        }
        goto LAB_0011f8ea;
      }
      if (Mode != 0x40) goto LAB_0011f985;
      pCVar4 = this->m_pPointS;
      uVar12 = (ulong)(uint)(int)pCVar4->m_iX;
      uVar17 = (ulong)(uint)(int)pCVar4->m_iY;
      if ((CObject::m_pDesign->field_0xc51 & 4) == 0) {
        fprintf((FILE *)pFile,"(%d,%d,0)-(%d,%d,0)\n",uVar12,uVar17,
                (ulong)(uint)(int)this->m_pPointE->m_iX,(ulong)(uint)(int)this->m_pPointE->m_iY);
        goto LAB_0011f8ea;
      }
      uVar11 = (uint)pCVar4->m_cZ;
      sVar2 = this->m_pPointE->m_iX;
      sVar3 = this->m_pPointE->m_iY;
      pcVar13 = "(%d,%d,%d)-(%d,%d,%d)\n";
LAB_0011f8d8:
      pcVar15 = (char *)(ulong)(uint)(int)sVar3;
    }
    fprintf((FILE *)pFile,pcVar13,uVar12,uVar17,(ulong)uVar11,(ulong)(uint)(int)sVar2,pcVar15);
  }
  else {
    if (Mode < 0x200) {
      if (Mode != 0x80) {
        if (Mode != 0x100) goto LAB_0011f985;
        uVar12 = (ulong)(-((this->super_CObject).m_iState & 1U) & 3);
        uVar17 = (ulong)((((this->super_CObject).m_iProp & 5U) == 0) + 3);
        uVar11 = (uint)this->m_pPointS->m_iX;
        sVar2 = this->m_pPointS->m_iY;
        sVar3 = this->m_pPointE->m_iX;
        pcVar13 = "plot \'-\' w linespoints lt %d lw 1 pt %d ps 1\n %d %d\n %d %d\ne\n";
        goto LAB_0011f8d8;
      }
      pCVar4 = this->m_pPointS;
      fprintf((FILE *)pFile,"plot3([%d,%d],[%d,%d],[%d,%d],\'%c\');\n",
              (ulong)(uint)(int)pCVar4->m_iX,(ulong)(uint)(int)pCVar4->m_iX,
              (ulong)(uint)(int)pCVar4->m_iY,(ulong)(uint)(int)pCVar4->m_iY,
              (ulong)(uint)(int)pCVar4->m_cZ,(ulong)(uint)(int)pCVar4->m_cZ,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      pCVar4 = this->m_pPointE;
      fprintf((FILE *)pFile,"plot3([%d,%d],[%d,%d],[%d,%d],\'%c\');\n",
              (ulong)(uint)(int)pCVar4->m_iX,(ulong)(uint)(int)pCVar4->m_iX,
              (ulong)(uint)(int)pCVar4->m_iY,(ulong)(uint)(int)pCVar4->m_iY,
              (ulong)(uint)(int)pCVar4->m_cZ,(ulong)(uint)(int)pCVar4->m_cZ,
              (ulong)((uint)(((this->super_CObject).m_iProp & 5) == 0) * 5 + 0x73));
      pCVar4 = this->m_pPointE;
      pCVar5 = this->m_pPointS;
      uVar14 = (uint)pCVar5->m_iX;
      uVar11 = (uint)pCVar4->m_iX;
      sVar3 = pCVar5->m_iY;
      sVar2 = pCVar4->m_iY;
      cVar1 = pCVar5->m_cZ;
      uVar16 = (uint)pCVar4->m_cZ;
      pcVar15 = "-";
      if (((this->super_CObject).m_iState & 1) == 0) {
        pcVar15 = "-.";
      }
      pcVar13 = "plot3([%d,%d],[%d,%d],[%d,%d],\'%s\');\n";
    }
    else {
      if (Mode != 0x200) {
        if (Mode == 0x2000) {
          Key = (this->m_pPointS->super_CObject).m_Key;
          if ((~(this->super_CObject).m_iState & 5U) == 0) {
            sVar8 = fwrite(&Key,1,8,(FILE *)pFile);
            if (sVar8 == 0) {
              CObject::Display(1,"print a wire(S) in net(id:%d)\n",
                               (ulong)(uint)((this->super_CObject).m_pParent)->m_Key);
            }
            Key = (this->m_pPointE->super_CObject).m_Key;
          }
          else {
            Key = (longlong)((uint)Key & 0xffffff00);
            sVar8 = fwrite(&Key,1,8,(FILE *)pFile);
            if (sVar8 == 0) {
              CObject::Display(1,"print a wire(S) in net(id:%d)\n",
                               (ulong)(uint)((this->super_CObject).m_pParent)->m_Key);
            }
            Key = (longlong)((uint)(this->m_pPointE->super_CObject).m_Key & 0xffffff00);
          }
          sVar8 = fwrite(&Key,1,8,(FILE *)pFile);
          if (sVar8 == 0) {
            CObject::Display(1,"print a wire(E) in net(id:%d)\n",
                             (ulong)(uint)((this->super_CObject).m_pParent)->m_Key);
          }
          goto LAB_0011f8ea;
        }
LAB_0011f985:
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x335,"virtual void CWire::Print(FILE *, int)");
      }
      uVar14 = -((this->super_CObject).m_iState & 1U) & 3;
      uVar11 = (((this->super_CObject).m_iProp & 5U) == 0) + 3;
      pCVar4 = this->m_pPointS;
      sVar3 = pCVar4->m_iX;
      sVar2 = pCVar4->m_iY;
      cVar1 = pCVar4->m_cZ;
      uVar16 = (uint)this->m_pPointE->m_iX;
      pcVar15 = (char *)(ulong)(uint)(int)this->m_pPointE->m_iY;
      pcVar13 = "splot \'-\' w linespoints lt %d lw 1 pt %d ps 1\n %d %d %d\n %d %d %d\ne\n";
    }
    fprintf((FILE *)pFile,pcVar13,(ulong)uVar14,(ulong)uVar11,(ulong)(uint)(int)sVar3,
            (ulong)(uint)(int)sVar2,(ulong)(uint)(int)cVar1,(ulong)uVar16,pcVar15);
  }
LAB_0011f8ea:
  fflush((FILE *)pFile);
  return;
}

Assistant:

void CWire::Print(FILE *pFile, int Mode)
{
	if(pFile==NULL)	return;

	switch(Mode){
	case PRINT_MODE_DUMP:
		{
			KEY	Key;

			if(IsCompleted())
			{
				Key		=	m_pPointS->GetKey();
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(S) in net(id:%d)\n",(int)GetParent()->GetKey());

				Key		=	m_pPointE->GetKey();
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(E) in net(id:%d)\n",(int)GetParent()->GetKey());
			}
			else
			{
				Key		=	m_pPointS->GetKey()&0xFFFFFF00;
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(S) in net(id:%d)\n",(int)GetParent()->GetKey());

				Key		=	m_pPointE->GetKey()&0xFFFFFF00;
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(E) in net(id:%d)\n",(int)GetParent()->GetKey());
			}
		}
		break;
	case PRINT_MODE_GNUPLOT:
		fprintf(pFile,"plot '-' w linespoints lt %d lw 1 pt %d ps 1\n %d %d\n %d %d\ne\n",
			IsRouted()? 3:0,
			IsHorizontal()? 3:4,
			m_pPointS->X(),m_pPointS->Y(),
			m_pPointE->X(),m_pPointE->Y());
		break;
	case PRINT_MODE_GNUPLOT3D:
		fprintf(pFile,"splot '-' w linespoints lt %d lw 1 pt %d ps 1\n %d %d %d\n %d %d %d\ne\n",
			IsRouted()? 3:0,
			IsHorizontal()? 3:4,
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		break;
	case PRINT_MODE_MATLAB:
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%c');\n",
			m_pPointS->X(),m_pPointS->X(),m_pPointS->Y(),m_pPointS->Y(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%c');\n",
			m_pPointE->X(),m_pPointE->X(),m_pPointE->Y(),m_pPointE->Y(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%s');\n",
			m_pPointS->X(),m_pPointE->X(),
			m_pPointS->Y(),m_pPointE->Y(),
			IsRouted()? "-":"-.");			
		break;
	case PRINT_MODE_MATLAB3D:
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%c');\n",
			m_pPointS->X(),m_pPointS->X(),
			m_pPointS->Y(),m_pPointS->Y(),
			m_pPointS->Z(),m_pPointS->Z(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%c');\n",
			m_pPointE->X(),m_pPointE->X(),
			m_pPointE->Y(),m_pPointE->Y(),
			m_pPointE->Z(),m_pPointE->Z(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%s');\n",
			m_pPointS->X(),m_pPointE->X(),
			m_pPointS->Y(),m_pPointE->Y(),
			m_pPointS->Z(),m_pPointE->Z(),
			IsRouted()? "-":"-.");			
		break;
	case PRINT_MODE_SEGMENT:
		{
			fprintf(pFile,"-------------net(id:%d) - (%d,%d)-(%d,%d)\n",
				(int)GetParent()->GetKey(),
				m_pPointS->X(),m_pPointS->Y(),
				m_pPointE->X(),m_pPointE->Y());fflush(pFile);

			for (int i=0;i<GetNumSegmentList();++i)
			{
				vector<CSegment*>*	pSegmentList	=	GetSegmentList(i);
				fprintf(pFile,"*segment[%d]\n",i);
				for (int j=0;j<pSegmentList->size();++j)
					(*pSegmentList)[j]->Print(pFile,PRINT_MODE_TEXT);
			}
		}
		break;
	case PRINT_MODE_TEXT:	
#ifdef _DEBUG
		fprintf(pFile,"-w[0x%x] (%d,%d,%d)-(%d,%d,%d) %c",(ADDRESS)this,
#else
		fprintf(pFile,"-w (%d,%d,%d)-(%d,%d,%d) %c",
#endif
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z(),
			IsRouted()? 'o':'x');
		if(GetParent())	fprintf(pFile,":net(id:%d) ",(int)GetParent()->GetKey());
		fprintf(pFile,"\n");
		break;
	case PRINT_MODE_RESULT:
		if(GetDesign()->m_Param.GetProp()&PROP_PARAM_MULTILAYER)
		{
			fprintf(pFile,"(%d,%d,%d)-(%d,%d,%d)\n",
				m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
				m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		}
		else
		{
			fprintf(pFile,"(%d,%d,0)-(%d,%d,0)\n",
				m_pPointS->X(),m_pPointS->Y(),
				m_pPointE->X(),m_pPointE->Y());
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}